

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiColumnsSet::Clear(ImGuiColumnsSet *this)

{
  undefined4 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  *(undefined1 *)(in_RDI + 2) = 0;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 1;
  in_RDI[6] = 0;
  in_RDI[5] = 0;
  in_RDI[8] = 0;
  in_RDI[7] = 0;
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  ImVector<ImGuiColumnData>::clear((ImVector<ImGuiColumnData> *)this);
  return;
}

Assistant:

void Clear()
    {
        ID = 0;
        Flags = 0;
        IsFirstFrame = false;
        IsBeingResized = false;
        Current = 0;
        Count = 1;
        MinX = MaxX = 0.0f;
        LineMinY = LineMaxY = 0.0f;
        StartPosY = 0.0f;
        StartMaxPosX = 0.0f;
        Columns.clear();
    }